

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell.cc
# Opt level: O0

void __thiscall S2Cell::S2Cell(S2Cell *this,S2CellId id)

{
  int iVar1;
  R2Rect local_50;
  int8 local_30 [4];
  int local_2c;
  int orientation;
  int ij [2];
  S2Cell *this_local;
  S2CellId id_local;
  
  this_local = (S2Cell *)id.id_;
  S2Region::S2Region(&this->super_S2Region);
  (this->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Cell_0062d630;
  S2CellId::S2CellId(&this->id_);
  R2Rect::R2Rect(&this->uv_);
  (this->id_).id_ = (uint64)this_local;
  iVar1 = S2CellId::ToFaceIJOrientation
                    ((S2CellId *)&this_local,&local_2c,&orientation,(int *)local_30);
  this->face_ = (int8)iVar1;
  this->orientation_ = local_30[0];
  iVar1 = S2CellId::level((S2CellId *)&this_local);
  this->level_ = (int8)iVar1;
  S2CellId::IJLevelToBoundUV(&local_50,&local_2c,(int)this->level_);
  (this->uv_).bounds_[0].bounds_.c_[0] = local_50.bounds_[0].bounds_.c_[0];
  (this->uv_).bounds_[0].bounds_.c_[1] = local_50.bounds_[0].bounds_.c_[1];
  (this->uv_).bounds_[1].bounds_.c_[0] = local_50.bounds_[1].bounds_.c_[0];
  (this->uv_).bounds_[1].bounds_.c_[1] = local_50.bounds_[1].bounds_.c_[1];
  return;
}

Assistant:

S2Cell::S2Cell(S2CellId id) {
  id_ = id;
  int ij[2], orientation;
  face_ = id.ToFaceIJOrientation(&ij[0], &ij[1], &orientation);
  orientation_ = orientation;  // Compress int to a byte.
  level_ = id.level();
  uv_ = S2CellId::IJLevelToBoundUV(ij, level_);
}